

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall Scene::~Scene(Scene *this)

{
  Material **ppMVar1;
  Material *pMVar2;
  Texture **ppTVar3;
  Texture *pTVar4;
  Object **ppOVar5;
  Object *pOVar6;
  long lVar7;
  
  if (0 < this->m_materials_size) {
    lVar7 = 0;
    do {
      ppMVar1 = this->m_materials;
      pMVar2 = ppMVar1[lVar7];
      if (pMVar2 != (Material *)0x0) {
        (*pMVar2->_vptr_Material[1])();
        ppMVar1[lVar7] = (Material *)0x0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->m_materials_size);
  }
  if (this->m_materials != (Material **)0x0) {
    operator_delete__(this->m_materials);
    this->m_materials = (Material **)0x0;
  }
  if (0 < this->m_textures_size) {
    lVar7 = 0;
    do {
      ppTVar3 = this->m_textures;
      pTVar4 = ppTVar3[lVar7];
      if (pTVar4 != (Texture *)0x0) {
        (*pTVar4->_vptr_Texture[1])();
        ppTVar3[lVar7] = (Texture *)0x0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->m_textures_size);
  }
  if (this->m_textures != (Texture **)0x0) {
    operator_delete__(this->m_textures);
    this->m_textures = (Texture **)0x0;
  }
  if (0 < this->m_objects_size) {
    lVar7 = 0;
    do {
      ppOVar5 = this->m_objects;
      pOVar6 = ppOVar5[lVar7];
      if (pOVar6 != (Object *)0x0) {
        (*pOVar6->_vptr_Object[1])();
        ppOVar5[lVar7] = (Object *)0x0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->m_objects_size);
  }
  if (this->m_objects != (Object **)0x0) {
    operator_delete__(this->m_objects);
    this->m_objects = (Object **)0x0;
  }
  return;
}

Assistant:

Scene::~Scene()
{
    for(int i=0; i<m_materials_size; ++i) {
        safe_delete(m_materials[i]);
    }
    safe_array_delete(m_materials);

    for(int i=0; i<m_textures_size; ++i) {
        safe_delete(m_textures[i]);
    }
    safe_array_delete(m_textures);

    for(int i=0; i<m_objects_size; ++i) {
        safe_delete(m_objects[i]);
    }
    safe_array_delete(m_objects);
}